

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

void dumpAttribute(raw_ostream *OS,DWARFDie *Die,uint64_t *OffsetPtr,Attribute Attr,Form Form,
                  uint Indent,DIDumpOptions DumpOpts)

{
  size_t *psVar1;
  byte bVar2;
  bool bVar3;
  DWARFContext *pDVar4;
  MCRegisterInfo *MRI;
  DWARFObject *pDVar5;
  _Head_base<0UL,_const_llvm::DWARFObject_*,_false> Obj;
  char *pcVar6;
  DWARFSection *pDVar7;
  undefined8 uVar8;
  DIDumpOptions DumpOpts_00;
  DIDumpOptions DumpOpts_01;
  DIDumpOptions DumpOpts_02;
  DIDumpOptions DumpOpts_03;
  DIDumpOptions DumpOpts_04;
  DIDumpOptions DumpOpts_05;
  DIDumpOptions DumpOpts_06;
  DIDumpOptions DumpOpts_07;
  DIDumpOptions DumpOpts_08;
  long lVar9;
  undefined1 auVar10 [16];
  undefined2 uVar11;
  undefined1 uVar12;
  undefined7 uVar13;
  undefined2 uVar14;
  bool bVar15;
  undefined4 uVar16;
  DWARFDie DVar17;
  undefined1 auVar18 [8];
  bool bVar19;
  bool bVar20;
  uint16_t Version;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  size_t sVar25;
  LineTable *pLVar26;
  char *pcVar27;
  undefined8 *puVar28;
  raw_ostream *prVar29;
  DWARFObject *pDVar30;
  uint Indent_00;
  void *__buf;
  void *__buf_00;
  _func_int **V;
  void *extraout_RDX;
  Error *E;
  void *__buf_01;
  void *extraout_RDX_00;
  void *__buf_02;
  void *extraout_RDX_01;
  void *__buf_03;
  DWARFAddressRange *R;
  DWARFUnit *pDVar31;
  HighlightColor Color;
  ulong uVar32;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar33;
  Optional<unsigned_long> OVar34;
  StringRef Str;
  StringRef SVar35;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef CompDir;
  undefined5 uStack_3d8;
  undefined3 uStack_3d3;
  char BaseIndent [13];
  DWARFDataExtractor Data;
  long local_390;
  _func_int **pp_Stack_210;
  uint64_t Index;
  uint8_t local_200;
  uint8_t local_1ff;
  DWARFObject *local_1f8;
  DWARFSection *local_1f0;
  ErrorAdapter local_1e8;
  DWARFUnit *local_1d8;
  DWARFUnit *local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aStack_1c0;
  uint local_1b8;
  undefined1 auStack_1a8 [8];
  string Space;
  undefined1 local_140;
  undefined1 auStack_138 [8];
  uint64_t HighPC;
  undefined1 local_128 [72];
  uint64_t Offset;
  string File;
  undefined1 local_b8 [8];
  DWARFFormValue FormValue;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 aStack_80;
  DWARFUnit *local_70;
  Form local_3a;
  undefined2 local_38;
  undefined1 local_36;
  Form Form_local;
  Attribute Attr_local;
  undefined4 extraout_var;
  
  if (Die->U == (DWARFUnit *)0x0) {
    return;
  }
  if (Die->Die == (DWARFDebugInfoEntry *)0x0) {
    return;
  }
  builtin_strncpy(BaseIndent,"    ",5);
  uStack_3d8 = 0x2020202020;
  uStack_3d3 = 0x202020;
  local_3a = Form;
  Form_local = Attr;
  sVar25 = strlen((char *)&uStack_3d8);
  SVar35.Length = sVar25;
  SVar35.Data = (char *)&uStack_3d8;
  llvm::raw_ostream::operator<<(OS,SVar35);
  llvm::raw_ostream::indent(OS,Indent + 2);
  llvm::WithColor::WithColor((WithColor *)auStack_138,OS,Attribute,false);
  auStack_1a8 = (undefined1  [8])&PTR_anchor_010986c8;
  Space._M_dataplus._M_p = (pointer)&Form_local;
  Fmt.Length = 3;
  Fmt.Data = "{0}";
  llvm::
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_>_>::
  formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_>_>
                  *)(BaseIndent + 8),Fmt,
                 (tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Attribute_&>_> *)
                 auStack_1a8);
  llvm::raw_ostream::operator<<((raw_ostream *)auStack_138,(formatv_object_base *)(BaseIndent + 8));
  if (Data.Section != (DWARFSection *)0x0) {
    operator_delete(Data.Section,local_390 - (long)Data.Section);
  }
  if (Data.super_DataExtractor.Data.Length != 0) {
    operator_delete((void *)Data.super_DataExtractor.Data.Length,
                    (long)Data.Obj - Data.super_DataExtractor.Data.Length);
  }
  llvm::WithColor::~WithColor((WithColor *)auStack_138);
  if ((DumpOpts.Verbose != false) || (DumpOpts.ShowForm == true)) {
    auStack_1a8 = (undefined1  [8])&PTR_anchor_010986f8;
    Space._M_dataplus._M_p = (pointer)&local_3a;
    Fmt_00.Length = 6;
    Fmt_00.Data = " [{0}]";
    llvm::formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>::
    formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_>_>
                    *)(BaseIndent + 8),Fmt_00,
                   (tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Form_&>_> *)auStack_1a8
                  );
    llvm::raw_ostream::operator<<(OS,(formatv_object_base *)(BaseIndent + 8));
    if (Data.Section != (DWARFSection *)0x0) {
      operator_delete(Data.Section,local_390 - (long)Data.Section);
    }
    if (Data.super_DataExtractor.Data.Length != 0) {
      operator_delete((void *)Data.super_DataExtractor.Data.Length,
                      (long)Data.Obj - Data.super_DataExtractor.Data.Length);
    }
  }
  pDVar31 = Die->U;
  llvm::DWARFFormValue::createFromUnit((DWARFFormValue *)local_b8,local_3a,pDVar31,OffsetPtr);
  Str_00.Length = 2;
  Str_00.Data = "\t(";
  llvm::raw_ostream::operator<<(OS,Str_00);
  Offset = (uint64_t)&File._M_string_length;
  File._M_dataplus._M_p = (pointer)0x0;
  File._M_string_length._0_1_ = 0;
  if ((Form_local == 0x58) || (Form_local == (DW_FORM_ref_sig8|DW_FORM_strx))) {
    pLVar26 = llvm::DWARFContext::getLineTableForUnit(pDVar31->Context,pDVar31);
    Color = String;
    if (pLVar26 == (LineTable *)0x0) goto LAB_00d85799;
    OVar34 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
    if (((undefined1  [16])OVar34.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pcVar27 = llvm::DWARFUnit::getCompilationDir(pDVar31);
      if (pcVar27 == (char *)0x0) {
        OffsetPtr = (uint64_t *)0x0;
      }
      else {
        OffsetPtr = (uint64_t *)strlen(pcVar27);
      }
      CompDir.Length = (size_t)OffsetPtr;
      CompDir.Data = pcVar27;
      bVar19 = llvm::DWARFDebugLine::Prologue::getFileNameByIndex
                         (&pLVar26->Prologue,OVar34.Storage.field_0.value,CompDir,AbsoluteFilePath,
                          (string *)&Offset,native);
      if (bVar19) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_1a8,'\"',
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&Offset)
        ;
        puVar28 = (undefined8 *)
                  std::__cxx11::string::_M_replace_aux
                            ((ulong)auStack_1a8,(ulong)Space._M_dataplus._M_p,0,'\x01');
        psVar1 = &Data.super_DataExtractor.Data.Length;
        OffsetPtr = puVar28 + 2;
        if ((DWARFUnit *)*puVar28 == (DWARFUnit *)OffsetPtr) {
          Data.super_DataExtractor.Data.Length = (size_t)((DWARFUnit *)OffsetPtr)->_vptr_DWARFUnit;
          Data.super_DataExtractor._16_8_ = puVar28[3];
          unique0x10002228 = (DWARFUnit *)psVar1;
        }
        else {
          Data.super_DataExtractor.Data.Length = (size_t)((DWARFUnit *)OffsetPtr)->_vptr_DWARFUnit;
          unique0x10002220 = (DWARFUnit *)*puVar28;
        }
        Data.super_DataExtractor.Data.Data = (char *)puVar28[1];
        *puVar28 = OffsetPtr;
        puVar28[1] = 0;
        *(undefined1 *)(puVar28 + 2) = 0;
        std::__cxx11::string::operator=((string *)&Offset,(string *)(BaseIndent + 8));
        if (stack0xfffffffffffffc38 != (DWARFUnit *)psVar1) {
          operator_delete(stack0xfffffffffffffc38,Data.super_DataExtractor.Data.Length + 1);
        }
        if (auStack_1a8 != (undefined1  [8])&Space._M_string_length) {
          operator_delete((void *)auStack_1a8,
                          CONCAT17(Space._M_string_length._7_1_,
                                   CONCAT25(Space._M_string_length._5_2_,
                                            CONCAT14(Space._M_string_length._4_1_,
                                                     (uint)Space._M_string_length))) + 1);
        }
        Str.Length = (size_t)File._M_dataplus._M_p;
        Str.Data = (char *)Offset;
      }
      else {
        Str = (StringRef)ZEXT816(0);
      }
      goto LAB_00d858b7;
    }
LAB_00d8656d:
    pcVar27 = 
    "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]";
LAB_00d86582:
    __assert_fail("hasVal",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                  ,0xad,pcVar27);
  }
  OVar34 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
  Color = Enumerator;
  if (((undefined1  [16])OVar34.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00d85799:
    Str = (StringRef)ZEXT816(0);
  }
  else {
    Str = llvm::dwarf::AttributeValueString(Form_local,OVar34.Storage.field_0._0_4_);
  }
LAB_00d858b7:
  if (Str.Length == 0) {
    if (Form_local == DW_FORM_ref2) {
      if (((DumpOpts.ShowForm != false) || (DumpOpts.Verbose != false)) ||
         (OVar34 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8),
         ((undefined1  [16])OVar34.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0))
      goto LAB_00d859c0;
      if (DumpOpts.ShowAddresses == true) {
        OffsetPtr = (uint64_t *)&stack0xfffffffffffffdf0;
        bVar19 = llvm::DWARFDie::getLowAndHighPC
                           (Die,(uint64_t *)auStack_1a8,(uint64_t *)auStack_138,OffsetPtr);
        if (bVar19) {
          Data.super_DataExtractor.Data.Data = "0x%016lx";
          stack0xfffffffffffffc38 = (DWARFUnit *)&PTR_home_01097f70;
          Data.super_DataExtractor.Data.Length = (size_t)auStack_138;
          llvm::raw_ostream::operator<<(OS,(format_object_base *)(BaseIndent + 8));
        }
        else {
          OffsetPtr = (uint64_t *)&DumpOpts;
          DumpOpts_06.ShowForm = DumpOpts.ShowForm;
          DumpOpts_06.ShowChildren = DumpOpts.ShowChildren;
          DumpOpts_06.ShowParents = DumpOpts.ShowParents;
          DumpOpts_06.SummarizeTypes = DumpOpts.SummarizeTypes;
          DumpOpts_06.Verbose = DumpOpts.Verbose;
          DumpOpts_06.DisplayRawContents = DumpOpts.DisplayRawContents;
          DumpOpts_06._22_2_ = DumpOpts._22_2_;
          DumpOpts_06.ShowAddresses = DumpOpts.ShowAddresses;
          DumpOpts_06.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
          DumpOpts_06.Version = DumpOpts.Version;
          DumpOpts_06.AddrSize = DumpOpts.AddrSize;
          DumpOpts_06.DumpType = DumpOpts.DumpType;
          DumpOpts_06.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
          llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_06);
        }
      }
    }
    else if ((Form_local == 0x59) || (Form_local == (DW_FORM_ref_sig8|DW_FORM_addrx))) {
      OVar34 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
      if (((undefined1  [16])OVar34.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
      goto LAB_00d8656d;
      llvm::raw_ostream::operator<<(OS,OVar34.Storage.field_0.value);
    }
    else {
LAB_00d859c0:
      bVar20 = llvm::DWARFAttribute::mayHaveLocationDescription(Form_local);
      uVar16 = DumpOpts._20_4_;
      bVar15 = DumpOpts.SummarizeTypes;
      bVar3 = DumpOpts.ShowForm;
      uVar14 = DumpOpts._16_2_;
      bVar19 = DumpOpts.ShowAddresses;
      uVar13 = DumpOpts._8_7_;
      if (bVar20) {
        OffsetPtr = (uint64_t *)&DumpOpts;
        uVar23 = CONCAT13(DumpOpts.SummarizeTypes,CONCAT12(DumpOpts.ShowForm,DumpOpts._16_2_));
        DumpOpts_05.Verbose = DumpOpts.Verbose;
        DumpOpts_05.DisplayRawContents = DumpOpts.DisplayRawContents;
        DumpOpts_05._22_2_ = DumpOpts._22_2_;
        DumpOpts_05.ShowChildren = (bool)DumpOpts.ShowChildren;
        DumpOpts_05.ShowParents = (bool)DumpOpts.ShowParents;
        DumpOpts_05.ShowForm = DumpOpts.ShowForm;
        DumpOpts_05.SummarizeTypes = DumpOpts.SummarizeTypes;
        uVar8 = CONCAT17(DumpOpts.ShowAddresses,DumpOpts._8_7_);
        FormValue.C = (DWARFContext *)DumpOpts._0_8_;
        pDVar4 = pDVar31->Context;
        MRI = (pDVar4->RegInfo)._M_t.
              super___uniq_ptr_impl<llvm::MCRegisterInfo,_std::default_delete<llvm::MCRegisterInfo>_>
              ._M_t.
              super__Tuple_impl<0UL,_llvm::MCRegisterInfo_*,_std::default_delete<llvm::MCRegisterInfo>_>
              .super__Head_base<0UL,_llvm::MCRegisterInfo_*,_false>._M_head_impl;
        pDVar5 = (pDVar4->DObj)._M_t.
                 super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                 .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
        bVar20 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_b8,FC_Block);
        if ((bVar20) ||
           (bVar20 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_b8,FC_Exprloc),
           bVar20)) {
          llvm::DWARFFormValue::getAsBlock
                    ((Optional<llvm::ArrayRef<unsigned_char>_> *)(BaseIndent + 8),
                     (DWARFFormValue *)local_b8);
          DVar17 = stack0xfffffffffffffc38;
          if ((char)Data.super_DataExtractor.Data.Length == '\0') {
            pcVar27 = 
            "T &llvm::optional_detail::OptionalStorage<llvm::ArrayRef<unsigned char>>::getValue() & [T = llvm::ArrayRef<unsigned char>]"
            ;
            goto LAB_00d86582;
          }
          iVar21 = (*((pDVar4->DObj)._M_t.
                      super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                      .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                     _vptr_DWARFObject[5])();
          uVar8 = Data.super_DataExtractor._16_8_;
          uVar11 = (pDVar31->Header).FormParams.Version;
          uVar12 = (pDVar31->Header).FormParams.AddrSize;
          Data.super_DataExtractor._18_1_ = uVar12;
          Data.super_DataExtractor._16_2_ = uVar11;
          Data.super_DataExtractor.Data.Length._0_2_ = CONCAT11(0,(byte)iVar21);
          Data.super_DataExtractor._19_5_ = SUB85(uVar8,3);
          uVar23 = (uint)(pDVar31->Header).FormParams.AddrSize;
          unique0x10002230 = DVar17;
          if ((8 < uVar23) || ((0x114U >> (uVar23 & 0x1f) & 1) == 0)) {
            __assert_fail("AddressSize == 8 || AddressSize == 4 || AddressSize == 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFExpression.h"
                          ,0x84,
                          "llvm::DWARFExpression::DWARFExpression(DataExtractor, uint16_t, uint8_t)"
                         );
          }
          OffsetPtr = (uint64_t *)pDVar31;
          llvm::DWARFExpression::print((DWARFExpression *)(BaseIndent + 8),OS,MRI,pDVar31,false);
        }
        else {
          bVar20 = llvm::DWARFFormValue::isFormClass((DWARFFormValue *)local_b8,FC_SectionOffset);
          if (bVar20) {
            OVar34 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_b8);
            if (((undefined1  [16])OVar34.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
            goto LAB_00d8656d;
            local_128._64_8_ = OVar34.Storage.field_0.value;
            llvm::DWARFUnit::getBaseAddress
                      ((Optional<llvm::object::SectionedAddress> *)(BaseIndent + 8),pDVar31);
            if ((char)Data.super_DataExtractor.Data.Length == '\0') {
              local_70 = (DWARFUnit *)0x0;
            }
            else {
              local_70 = stack0xfffffffffffffc38;
            }
            Indent_00 = Indent + 0x11;
            OffsetPtr = (uint64_t *)(ulong)Indent_00;
            aStack_80.value.Address._0_4_ = (undefined4)uVar13;
            aStack_80.value.Address._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
            local_1c8 = FormValue.C._0_4_;
            uStack_1c4 = FormValue.C._4_4_;
            aStack_1c0.value._0_4_ = aStack_80.value.Address._0_4_;
            aStack_1c0.value._4_4_ = aStack_80.value.Address._4_4_;
            aStack_80.value.SectionIndex._7_1_ = SUB41(uVar16,3);
            local_36 = aStack_80.value.SectionIndex._7_1_;
            aStack_80.value.SectionIndex._5_2_ = SUB42(uVar16,1);
            local_38 = aStack_80.value.SectionIndex._5_2_;
            bVar3 = pDVar31->IsDWO;
            local_1b8 = uVar23;
            if (bVar3 == false) {
              pDVar7 = (pDVar31->field_7).LocSection;
              if ((pDVar7->Data).Length != 0) {
                Data.super_DataExtractor.Data.Data = (char *)0x400000000;
                stack0xfffffffffffffc38 = (DWARFUnit *)&Data.super_DataExtractor.Data.Length;
                iVar21 = (*((pDVar4->DObj)._M_t.
                            super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                            .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                           _vptr_DWARFObject[5])();
                iVar22 = (*pDVar5->_vptr_DWARFObject[6])(pDVar5);
                pp_Stack_210 = (_func_int **)(pDVar7->Data).Data;
                Index = (pDVar7->Data).Length;
                local_200 = (uint8_t)iVar21;
                local_1ff = (uint8_t)iVar22;
                DumpOpts_05.ParentRecurseDepth = (int)uVar13;
                DumpOpts_05.Version = SUB72(uVar13,4);
                DumpOpts_05.AddrSize = SUB71(uVar13,6);
                DumpOpts_05.ShowAddresses = bVar19;
                DumpOpts_05._0_8_ = FormValue.C;
                local_1f8 = pDVar5;
                local_1f0 = pDVar7;
                llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_05);
                pcVar27 = OS->OutBufCur;
                sVar25 = (long)OS->OutBufEnd - (long)pcVar27;
                if (sVar25 < 2) {
                  llvm::raw_ostream::write(OS,0xe0f1b5,(void *)0x2,sVar25);
                }
                else {
                  pcVar27[0] = ':';
                  pcVar27[1] = ' ';
                  OS->OutBufCur = OS->OutBufCur + 2;
                }
                OffsetPtr = (uint64_t *)(local_128 + 0x40);
                llvm::DWARFDebugLoc::parseOneLocationList
                          ((Expected<llvm::DWARFDebugLoc::LocationList> *)auStack_1a8,
                           (DWARFDebugLoc *)(BaseIndent + 8),
                           (DWARFDataExtractor *)&stack0xfffffffffffffdf0,OffsetPtr);
                if ((local_140 & 1) == 0) {
                  uVar23 = (*((pDVar4->DObj)._M_t.
                              super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                              .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)
                             ->_vptr_DWARFObject[5])();
                  uVar24 = (*pDVar5->_vptr_DWARFObject[6])(pDVar5);
                  local_128._0_4_ = local_1b8;
                  auStack_138 = (undefined1  [8])CONCAT44(uStack_1c4,local_1c8);
                  HighPC = CONCAT44(aStack_1c0.value._4_4_,aStack_1c0.value._0_4_);
                  local_128[4] = 0;
                  local_128[5] = (undefined1)local_38;
                  local_128[6] = (undefined1)((ushort)local_38 >> 8);
                  local_128[7] = local_36;
                  DumpOpts_08.Verbose = false;
                  DumpOpts_08.ShowChildren = (bool)(undefined1)local_1b8;
                  DumpOpts_08.ShowParents = (bool)local_1b8._1_1_;
                  DumpOpts_08.ShowForm = (bool)local_1b8._2_1_;
                  DumpOpts_08.SummarizeTypes = (bool)local_1b8._3_1_;
                  DumpOpts_08.DisplayRawContents = (bool)local_128[5];
                  DumpOpts_08._22_1_ = local_128[6];
                  DumpOpts_08._23_1_ = local_36;
                  OffsetPtr = (uint64_t *)(ulong)(uVar23 & 0xff);
                  DumpOpts_08.ParentRecurseDepth = aStack_1c0._0_4_;
                  DumpOpts_08.Version = (short)aStack_1c0._4_4_;
                  DumpOpts_08.AddrSize = (char)((uint)aStack_1c0._4_4_ >> 0x10);
                  DumpOpts_08.ShowAddresses = (bool)(char)((uint)aStack_1c0._4_4_ >> 0x18);
                  DumpOpts_08._0_8_ = auStack_138;
                  llvm::DWARFDebugLoc::LocationList::dump
                            ((LocationList *)auStack_1a8,OS,(uint64_t)local_70,SUB41(uVar23,0),
                             uVar24 & 0xff,MRI,pDVar31,DumpOpts_08,Indent_00);
                }
                else {
                  pcVar27 = OS->OutBufCur;
                  if (pcVar27 < OS->OutBufEnd) {
                    OffsetPtr = (uint64_t *)(pcVar27 + 1);
                    OS->OutBufCur = (char *)OffsetPtr;
                    *pcVar27 = '\n';
                  }
                  else {
                    llvm::raw_ostream::write(OS,10,__buf_03,(size_t)OffsetPtr);
                  }
                  llvm::raw_ostream::indent(OS,Indent_00);
                  auVar18 = auStack_1a8;
                  local_1e8.super_FormatAdapter<llvm::Error>.Item.Payload = (ErrorInfoBase *)0x1;
                  if ((local_140 & 1) != 0) {
                    auStack_1a8[0] = '\0';
                    auStack_1a8[1] = '\0';
                    auStack_1a8[2] = '\0';
                    auStack_1a8[3] = '\0';
                    auStack_1a8[4] = '\0';
                    auStack_1a8[5] = '\0';
                    auStack_1a8[6] = '\0';
                    auStack_1a8[7] = '\0';
                    local_1e8.super_FormatAdapter<llvm::Error>.Item.Payload =
                         (ErrorInfoBase *)((ulong)auVar18 | 1);
                  }
                  local_1e8.super_FormatAdapter<llvm::Error>.super_format_adapter.
                  _vptr_format_adapter = (_func_int **)&PTR_anchor_01098728;
                  llvm::formatv<llvm::detail::ErrorAdapter>
                            ((formatv_object<std::tuple<llvm::detail::ErrorAdapter>_> *)auStack_138,
                             "error extracting location list: {0}",&local_1e8);
                  llvm::raw_ostream::operator<<(OS,(formatv_object_base *)auStack_138);
                  llvm::formatv_object<std::tuple<llvm::detail::ErrorAdapter>_>::~formatv_object
                            ((formatv_object<std::tuple<llvm::detail::ErrorAdapter>_> *)auStack_138)
                  ;
                  llvm::detail::ErrorAdapter::~ErrorAdapter(&local_1e8);
                }
                llvm::Expected<llvm::DWARFDebugLoc::LocationList>::~Expected
                          ((Expected<llvm::DWARFDebugLoc::LocationList> *)auStack_1a8);
                llvm::SmallVector<llvm::DWARFDebugLoc::LocationList,_4U>::~SmallVector
                          ((SmallVector<llvm::DWARFDebugLoc::LocationList,_4U> *)(BaseIndent + 8));
                goto LAB_00d85aea;
              }
              iVar21 = (*pDVar5->_vptr_DWARFObject[0xb])(pDVar5);
              pDVar30 = (DWARFObject *)CONCAT44(extraout_var,iVar21);
              iVar21 = (*((pDVar4->DObj)._M_t.
                          super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                          .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                         _vptr_DWARFObject[5])();
              iVar22 = (*pDVar5->_vptr_DWARFObject[6])(pDVar5);
              unique0x100013c9 = (DWARFUnit *)pDVar30->_vptr_DWARFObject;
              Data.super_DataExtractor.Data.Data = (pDVar30->Dummy).Data.Data;
              Data.super_DataExtractor.Data.Length._0_2_ = CONCAT11((char)iVar22,(char)iVar21);
              Data.super_DataExtractor._16_8_ = pDVar5;
              Data.Obj = pDVar30;
            }
            else {
              local_1d8 = (DWARFUnit *)(pDVar31->field_7).LocSection;
              local_1d0 = (DWARFUnit *)(pDVar31->field_7).LocSectionData.Length;
              iVar21 = (*((pDVar4->DObj)._M_t.
                          super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                          .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                         _vptr_DWARFObject[5])();
              iVar22 = (*pDVar5->_vptr_DWARFObject[6])(pDVar5);
              Data.super_DataExtractor.Data.Data = (char *)local_1d0;
              stack0xfffffffffffffc38 = local_1d8;
              Data.super_DataExtractor.Data.Length._0_2_ = CONCAT11((char)iVar22,(char)iVar21);
              Data.super_DataExtractor.IsLittleEndian = '\0';
              Data.super_DataExtractor.AddressSize = '\0';
              Data.super_DataExtractor._18_6_ = 0;
              Data.Obj = (DWARFObject *)0x0;
              OffsetPtr = (uint64_t *)local_1d0;
            }
            if (Data.super_DataExtractor.Data.Data != (char *)0x0) {
              Version = 4;
              if (bVar3 == false) {
                Version = (pDVar31->Header).FormParams.Version;
              }
              Space._M_string_length._0_4_ = local_1b8;
              auStack_1a8[4] = (undefined1)uStack_1c4;
              auStack_1a8[5] = uStack_1c4._1_1_;
              auStack_1a8[6] = uStack_1c4._2_1_;
              auStack_1a8[7] = uStack_1c4._3_1_;
              auStack_1a8[0] = (undefined1)local_1c8;
              auStack_1a8[1] = local_1c8._1_1_;
              auStack_1a8[2] = local_1c8._2_1_;
              auStack_1a8[3] = local_1c8._3_1_;
              Space._M_dataplus._M_p =
                   (pointer)CONCAT44(aStack_1c0.value._4_4_,aStack_1c0.value._0_4_);
              Space._M_string_length._4_1_ = 0;
              Space._M_string_length._5_2_ = local_38;
              Space._M_string_length._7_1_ = local_36;
              DumpOpts_07.Verbose = false;
              DumpOpts_07.ShowChildren = (bool)(undefined1)local_1b8;
              DumpOpts_07.ShowParents = (bool)local_1b8._1_1_;
              DumpOpts_07.ShowForm = (bool)local_1b8._2_1_;
              DumpOpts_07.SummarizeTypes = (bool)local_1b8._3_1_;
              DumpOpts_07._21_2_ = local_38;
              DumpOpts_07._23_1_ = local_36;
              DumpOpts_07._8_8_ = Space._M_dataplus._M_p;
              DumpOpts_07._0_8_ = auStack_1a8;
              OffsetPtr = (uint64_t *)OS;
              llvm::DWARFDebugLoclists::dumpLocationList
                        ((DWARFDataExtractor *)(BaseIndent + 8),(uint64_t *)(local_128 + 0x40),
                         Version,OS,(uint64_t)local_70,MRI,pDVar31,DumpOpts_07,Indent_00);
            }
          }
          else {
            DumpOpts_04.ParentRecurseDepth = (int)uVar13;
            DumpOpts_04.Version = SUB72(uVar13,4);
            DumpOpts_04.AddrSize = SUB71(uVar13,6);
            DumpOpts_04.ShowAddresses = bVar19;
            DumpOpts_04._0_8_ = FormValue.C;
            DumpOpts_04.ShowChildren = (bool)(char)uVar14;
            DumpOpts_04.ShowParents = (bool)SUB21(uVar14,1);
            DumpOpts_04.ShowForm = bVar3;
            DumpOpts_04.SummarizeTypes = bVar15;
            DumpOpts_04.Verbose = (bool)(char)uVar16;
            DumpOpts_04.DisplayRawContents = (bool)SUB41(uVar16,1);
            DumpOpts_04._22_2_ = SUB42(uVar16,2);
            llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_04);
          }
        }
      }
      else {
        OffsetPtr = (uint64_t *)&DumpOpts;
        DumpOpts_00.ShowForm = DumpOpts.ShowForm;
        DumpOpts_00.ShowChildren = DumpOpts.ShowChildren;
        DumpOpts_00.ShowParents = DumpOpts.ShowParents;
        DumpOpts_00.SummarizeTypes = DumpOpts.SummarizeTypes;
        DumpOpts_00.Verbose = DumpOpts.Verbose;
        DumpOpts_00.DisplayRawContents = DumpOpts.DisplayRawContents;
        DumpOpts_00._22_2_ = DumpOpts._22_2_;
        DumpOpts_00.ShowAddresses = DumpOpts.ShowAddresses;
        DumpOpts_00.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
        DumpOpts_00.Version = DumpOpts.Version;
        DumpOpts_00.AddrSize = DumpOpts.AddrSize;
        DumpOpts_00.DumpType = DumpOpts.DumpType;
        DumpOpts_00.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
        llvm::DWARFFormValue::dump((DWARFFormValue *)local_b8,OS,DumpOpts_00);
      }
    }
  }
  else {
    OffsetPtr = (uint64_t *)0x0;
    llvm::WithColor::WithColor((WithColor *)(BaseIndent + 8),OS,Color,false);
    llvm::raw_ostream::operator<<((raw_ostream *)stack0xfffffffffffffc38,Str);
    llvm::WithColor::~WithColor((WithColor *)(BaseIndent + 8));
  }
LAB_00d85aea:
  pcVar27 = "";
  if ((ulong)DumpOpts.ShowAddresses != 0) {
    pcVar27 = " ";
  }
  auStack_1a8 = (undefined1  [8])&Space._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)auStack_1a8,pcVar27,pcVar27 + DumpOpts.ShowAddresses);
  if (Form_local < 0x49) {
    if ((Form_local == (DW_FORM_ref_sig8|DW_FORM_ref1)) || (Form_local == 0x47)) {
      join_0x00000010_0x00000000_ =
           llvm::DWARFDie::getAttributeValueAsReferencedDie(Die,(DWARFFormValue *)local_b8);
      pcVar27 = llvm::DWARFDie::getName((DWARFDie *)(BaseIndent + 8),LinkageName);
      if (pcVar27 != (char *)0x0) {
        prVar29 = (raw_ostream *)
                  llvm::raw_ostream::write
                            (OS,auStack_1a8._0_4_,Space._M_dataplus._M_p,(size_t)OffsetPtr);
        Str_01.Length = 1;
        Str_01.Data = "\"";
        prVar29 = llvm::raw_ostream::operator<<(prVar29,Str_01);
        sVar25 = strlen(pcVar27);
        Str_02.Length = sVar25;
        Str_02.Data = pcVar27;
        prVar29 = llvm::raw_ostream::operator<<(prVar29,Str_02);
        pcVar27 = prVar29->OutBufCur;
        if (pcVar27 < prVar29->OutBufEnd) {
          prVar29->OutBufCur = pcVar27 + 1;
          *pcVar27 = '\"';
        }
        else {
          llvm::raw_ostream::write(prVar29,0x22,__buf,(size_t)pcVar27);
        }
      }
    }
    goto LAB_00d86079;
  }
  if (Form_local == 0x49) {
    prVar29 = (raw_ostream *)
              llvm::raw_ostream::write
                        (OS,auStack_1a8._0_4_,Space._M_dataplus._M_p,(size_t)OffsetPtr);
    Str_03.Length = 1;
    Str_03.Data = "\"";
    llvm::raw_ostream::operator<<(prVar29,Str_03);
    join_0x00000010_0x00000000_ =
         llvm::DWARFDie::getAttributeValueAsReferencedDie(Die,(DWARFFormValue *)local_b8);
    dumpTypeName(OS,(DWARFDie *)(BaseIndent + 8));
    pcVar27 = OS->OutBufCur;
    if (pcVar27 < OS->OutBufEnd) {
      OS->OutBufCur = pcVar27 + 1;
      *pcVar27 = '\"';
    }
    else {
      llvm::raw_ostream::write(OS,0x22,__buf_00,(size_t)OffsetPtr);
    }
    goto LAB_00d86079;
  }
  if (Form_local != 0x55) {
    if (Form_local == 0x3feb) {
      OVar34 = llvm::DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_b8);
      aVar33 = OVar34.Storage.field_0;
      if (((undefined1  [16])OVar34.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar27 = OS->OutBufCur;
        sVar25 = (long)OS->OutBufEnd - (long)pcVar27;
        if (sVar25 < 2) {
          llvm::raw_ostream::write(OS,0xe80013,(void *)0x2,sVar25);
        }
        else {
          pcVar27[0] = ' ';
          pcVar27[1] = '(';
          OS->OutBufCur = OS->OutBufCur + 2;
        }
        if (aVar33.value == 0) {
          sVar25 = 0x40;
        }
        else {
          sVar25 = 0;
          if (aVar33.value != 0) {
            for (; (aVar33.value >> sVar25 & 1) == 0; sVar25 = sVar25 + 1) {
            }
          }
        }
        uVar23 = (uint)sVar25;
        while( true ) {
          if (0x3f < uVar23) {
            __assert_fail("Shift < 64 && \"undefined behavior\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDie.cpp"
                          ,0x2c,"void dumpApplePropertyAttribute(raw_ostream &, uint64_t)");
          }
          uVar32 = 1L << ((byte)sVar25 & 0x3f);
          SVar35 = llvm::dwarf::ApplePropertyString((uint)uVar32);
          if (SVar35.Length == 0) {
            Data.super_DataExtractor.Data.Data = "DW_APPLE_PROPERTY_0x%lx";
            stack0xfffffffffffffc38 = (DWARFUnit *)&PTR_home_01097f70;
            Data.super_DataExtractor.Data.Length = uVar32;
            llvm::raw_ostream::operator<<(OS,(format_object_base *)(BaseIndent + 8));
          }
          else {
            llvm::raw_ostream::operator<<(OS,SVar35);
          }
          if (aVar33.value == uVar32) break;
          pcVar27 = OS->OutBufCur;
          sVar25 = (long)OS->OutBufEnd - (long)pcVar27;
          if (sVar25 < 2) {
            llvm::raw_ostream::write(OS,0xe57e2b,(void *)0x2,sVar25);
          }
          else {
            pcVar27[0] = ',';
            pcVar27[1] = ' ';
            OS->OutBufCur = OS->OutBufCur + 2;
          }
          aVar33.value = aVar33.value ^ uVar32;
          if (aVar33.value == 0) {
            sVar25 = 0x40;
          }
          else {
            sVar25 = 0;
            if (aVar33.value != 0) {
              for (; (aVar33.value >> sVar25 & 1) == 0; sVar25 = sVar25 + 1) {
              }
            }
          }
          uVar23 = (uint)sVar25;
        }
        if (OS->OutBufEnd == OS->OutBufCur) {
          llvm::raw_ostream::write(OS,0xe3810a,(void *)0x1,sVar25);
        }
        else {
          *OS->OutBufCur = ')';
          OS->OutBufCur = OS->OutBufCur + 1;
        }
      }
    }
    goto LAB_00d86079;
  }
  Obj._M_head_impl =
       (Die->U->Context->DObj)._M_t.
       super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
       .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  if (local_b8._0_2_ == DW_FORM_rnglistx) {
    OVar34 = llvm::DWARFFormValue::getAsSectionOffset((DWARFFormValue *)local_b8);
    if (((undefined1  [16])OVar34.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
    goto LAB_00d8656d;
    if ((pDVar31->RngListTable).Storage.hasVal == true) {
      OffsetPtr = (pDVar31->RngListTable).Storage.field_0.value.
                  super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar31->RngListTable).Storage.field_0.value.
                        super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)OffsetPtr >> 3) <=
          (ulong)OVar34.Storage.field_0._0_4_) goto LAB_00d85d2c;
      V = (&((DWARFUnit *)OffsetPtr)->_vptr_DWARFUnit)[OVar34.Storage.field_0._0_4_];
      bVar19 = true;
    }
    else {
LAB_00d85d2c:
      bVar19 = false;
      V = (_func_int **)0x0;
    }
    if (bVar19) {
      llvm::DWARFFormValue::createFromUValue(DW_FORM_sec_offset,(uint64_t)V);
      OffsetPtr = (uint64_t *)&DumpOpts;
      DumpOpts_01.ShowForm = DumpOpts.ShowForm;
      DumpOpts_01.ShowChildren = DumpOpts.ShowChildren;
      DumpOpts_01.ShowParents = DumpOpts.ShowParents;
      DumpOpts_01.SummarizeTypes = DumpOpts.SummarizeTypes;
      DumpOpts_01.Verbose = DumpOpts.Verbose;
      DumpOpts_01.DisplayRawContents = DumpOpts.DisplayRawContents;
      DumpOpts_01._22_2_ = DumpOpts._22_2_;
      DumpOpts_01.ShowAddresses = DumpOpts.ShowAddresses;
      DumpOpts_01.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
      DumpOpts_01.Version = DumpOpts.Version;
      DumpOpts_01.AddrSize = DumpOpts.AddrSize;
      DumpOpts_01.DumpType = DumpOpts.DumpType;
      DumpOpts_01.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
      llvm::DWARFFormValue::dump((DWARFFormValue *)(BaseIndent + 8),OS,DumpOpts_01);
    }
  }
  llvm::DWARFDie::getAddressRanges
            ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
              *)(BaseIndent + 8),Die);
  if ((Data.super_DataExtractor._16_8_ & 1) == 0) {
    if (DumpOpts.ShowAddresses == true) {
      bVar2 = (pDVar31->Header).FormParams.AddrSize;
      __buf_02 = extraout_RDX;
      if (DumpOpts.Verbose == true) {
        (**(code **)((long)(Obj._M_head_impl)->_vptr_DWARFObject + 0x20))();
        __buf_02 = extraout_RDX_00;
      }
      pcVar27 = Data.super_DataExtractor.Data.Data;
      if (stack0xfffffffffffffc38 != (DWARFUnit *)Data.super_DataExtractor.Data.Data) {
        pDVar31 = stack0xfffffffffffffc38;
        do {
          pcVar6 = OS->OutBufCur;
          if (pcVar6 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar6 + 1;
            *pcVar6 = '\n';
          }
          else {
            llvm::raw_ostream::write(OS,10,__buf_02,(size_t)OffsetPtr);
          }
          llvm::raw_ostream::indent(OS,Indent + 0x11);
          auStack_138 = (undefined1  [8])0xffffffffffffffff;
          HighPC = 0x1040000ffffffff;
          local_128[4] = 0;
          local_128[5] = 0;
          local_128._0_4_ = 0;
          lVar9 = (ulong)CONCAT11(local_128[7],local_128[6]) << 0x30;
          DumpOpts_02.ParentRecurseDepth = 0xffffffff;
          DumpOpts_02.Version = 0;
          DumpOpts_02.AddrSize = '\x04';
          DumpOpts_02.ShowAddresses = true;
          DumpOpts_02.DumpType = 0xffffffff;
          DumpOpts_02.ChildRecurseDepth = 0xffffffff;
          DumpOpts_02.ShowChildren = (bool)(char)lVar9;
          DumpOpts_02.ShowParents = (bool)(char)((ulong)lVar9 >> 8);
          DumpOpts_02.ShowForm = (bool)(char)((ulong)lVar9 >> 0x10);
          DumpOpts_02.SummarizeTypes = (bool)(char)((ulong)lVar9 >> 0x18);
          DumpOpts_02.Verbose = (bool)(char)((ulong)lVar9 >> 0x20);
          DumpOpts_02.DisplayRawContents = (bool)(char)((ulong)lVar9 >> 0x28);
          DumpOpts_02._22_2_ = (short)((ulong)lVar9 >> 0x30);
          llvm::DWARFAddressRange::dump((DWARFAddressRange *)pDVar31,OS,(uint)bVar2,DumpOpts_02);
          OffsetPtr = (uint64_t *)&DumpOpts;
          DumpOpts_03.ShowForm = DumpOpts.ShowForm;
          DumpOpts_03.ShowChildren = DumpOpts.ShowChildren;
          DumpOpts_03.ShowParents = DumpOpts.ShowParents;
          DumpOpts_03.SummarizeTypes = DumpOpts.SummarizeTypes;
          DumpOpts_03.Verbose = DumpOpts.Verbose;
          DumpOpts_03.DisplayRawContents = DumpOpts.DisplayRawContents;
          DumpOpts_03._22_2_ = DumpOpts._22_2_;
          DumpOpts_03.ShowAddresses = DumpOpts.ShowAddresses;
          DumpOpts_03.ParentRecurseDepth = DumpOpts.ParentRecurseDepth;
          DumpOpts_03.Version = DumpOpts.Version;
          DumpOpts_03.AddrSize = DumpOpts.AddrSize;
          DumpOpts_03.DumpType = DumpOpts.DumpType;
          DumpOpts_03.ChildRecurseDepth = DumpOpts.ChildRecurseDepth;
          llvm::DWARFFormValue::dumpAddressSection
                    (Obj._M_head_impl,OS,DumpOpts_03,(uint64_t)pDVar31->InfoSection);
          pDVar31 = (DWARFUnit *)&pDVar31->Header;
          __buf_02 = extraout_RDX_01;
        } while (pDVar31 != (DWARFUnit *)pcVar27);
      }
    }
  }
  else {
    prVar29 = llvm::WithColor::error();
    Str_04.Length = 0x19;
    Str_04.Data = "decoding address ranges: ";
    prVar29 = llvm::raw_ostream::operator<<(prVar29,Str_04);
    File.field_2._8_8_ = 1;
    if ((Data.super_DataExtractor._16_8_ & 1) != 0) {
      pDVar31 = stack0xfffffffffffffc38;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = Data.super_DataExtractor.Data.Data;
      stack0xfffffffffffffc38 = (DWARFDie)(auVar10 << 0x40);
      File.field_2._8_8_ = (ulong)pDVar31 | 1;
    }
    llvm::toString_abi_cxx11_((string *)auStack_138,(llvm *)(File.field_2._M_local_buf + 8),E);
    prVar29 = (raw_ostream *)
              llvm::raw_ostream::write(prVar29,auStack_138._0_4_,(void *)HighPC,(size_t)OffsetPtr);
    pcVar27 = prVar29->OutBufCur;
    if (pcVar27 < prVar29->OutBufEnd) {
      prVar29->OutBufCur = pcVar27 + 1;
      *pcVar27 = '\n';
    }
    else {
      llvm::raw_ostream::write(prVar29,10,__buf_01,(size_t)pcVar27);
    }
    if (auStack_138 != (undefined1  [8])local_128) {
      operator_delete((void *)auStack_138,
                      CONCAT17(local_128[7],
                               CONCAT16(local_128[6],
                                        CONCAT15(local_128[5],CONCAT14(local_128[4],local_128._0_4_)
                                                ))) + 1);
    }
    if ((long *)(File.field_2._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(File.field_2._8_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  llvm::Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
  ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
             *)(BaseIndent + 8));
LAB_00d86079:
  Str_05.Length = 2;
  Str_05.Data = ")\n";
  llvm::raw_ostream::operator<<(OS,Str_05);
  if (auStack_1a8 != (undefined1  [8])&Space._M_string_length) {
    operator_delete((void *)auStack_1a8,
                    CONCAT17(Space._M_string_length._7_1_,
                             CONCAT25(Space._M_string_length._5_2_,
                                      CONCAT14(Space._M_string_length._4_1_,
                                               (uint)Space._M_string_length))) + 1);
  }
  if ((size_type *)Offset != &File._M_string_length) {
    operator_delete((void *)Offset,
                    CONCAT71(File._M_string_length._1_7_,(undefined1)File._M_string_length) + 1);
  }
  return;
}

Assistant:

static void dumpAttribute(raw_ostream &OS, const DWARFDie &Die,
                          uint64_t *OffsetPtr, dwarf::Attribute Attr,
                          dwarf::Form Form, unsigned Indent,
                          DIDumpOptions DumpOpts) {
  if (!Die.isValid())
    return;
  const char BaseIndent[] = "            ";
  OS << BaseIndent;
  OS.indent(Indent + 2);
  WithColor(OS, HighlightColor::Attribute) << formatv("{0}", Attr);

  if (DumpOpts.Verbose || DumpOpts.ShowForm)
    OS << formatv(" [{0}]", Form);

  DWARFUnit *U = Die.getDwarfUnit();
  DWARFFormValue FormValue = DWARFFormValue::createFromUnit(Form, U, OffsetPtr);

  OS << "\t(";

  StringRef Name;
  std::string File;
  auto Color = HighlightColor::Enumerator;
  if (Attr == DW_AT_decl_file || Attr == DW_AT_call_file) {
    Color = HighlightColor::String;
    if (const auto *LT = U->getContext().getLineTableForUnit(U))
      if (LT->getFileNameByIndex(
              FormValue.getAsUnsignedConstant().getValue(),
              U->getCompilationDir(),
              DILineInfoSpecifier::FileLineInfoKind::AbsoluteFilePath, File)) {
        File = '"' + File + '"';
        Name = File;
      }
  } else if (Optional<uint64_t> Val = FormValue.getAsUnsignedConstant())
    Name = AttributeValueString(Attr, *Val);

  if (!Name.empty())
    WithColor(OS, Color) << Name;
  else if (Attr == DW_AT_decl_line || Attr == DW_AT_call_line)
    OS << *FormValue.getAsUnsignedConstant();
  else if (Attr == DW_AT_high_pc && !DumpOpts.ShowForm && !DumpOpts.Verbose &&
           FormValue.getAsUnsignedConstant()) {
    if (DumpOpts.ShowAddresses) {
      // Print the actual address rather than the offset.
      uint64_t LowPC, HighPC, Index;
      if (Die.getLowAndHighPC(LowPC, HighPC, Index))
        OS << format("0x%016" PRIx64, HighPC);
      else
        FormValue.dump(OS, DumpOpts);
    }
  } else if (DWARFAttribute::mayHaveLocationDescription(Attr))
    dumpLocation(OS, FormValue, U, sizeof(BaseIndent) + Indent + 4, DumpOpts);
  else
    FormValue.dump(OS, DumpOpts);

  std::string Space = DumpOpts.ShowAddresses ? " " : "";

  // We have dumped the attribute raw value. For some attributes
  // having both the raw value and the pretty-printed value is
  // interesting. These attributes are handled below.
  if (Attr == DW_AT_specification || Attr == DW_AT_abstract_origin) {
    if (const char *Name =
            Die.getAttributeValueAsReferencedDie(FormValue).getName(
                DINameKind::LinkageName))
      OS << Space << "\"" << Name << '\"';
  } else if (Attr == DW_AT_type) {
    OS << Space << "\"";
    dumpTypeName(OS, Die.getAttributeValueAsReferencedDie(FormValue));
    OS << '"';
  } else if (Attr == DW_AT_APPLE_property_attribute) {
    if (Optional<uint64_t> OptVal = FormValue.getAsUnsignedConstant())
      dumpApplePropertyAttribute(OS, *OptVal);
  } else if (Attr == DW_AT_ranges) {
    const DWARFObject &Obj = Die.getDwarfUnit()->getContext().getDWARFObj();
    // For DW_FORM_rnglistx we need to dump the offset separately, since
    // we have only dumped the index so far.
    if (FormValue.getForm() == DW_FORM_rnglistx)
      if (auto RangeListOffset =
              U->getRnglistOffset(*FormValue.getAsSectionOffset())) {
        DWARFFormValue FV = DWARFFormValue::createFromUValue(
            dwarf::DW_FORM_sec_offset, *RangeListOffset);
        FV.dump(OS, DumpOpts);
      }
    if (auto RangesOrError = Die.getAddressRanges())
      dumpRanges(Obj, OS, RangesOrError.get(), U->getAddressByteSize(),
                 sizeof(BaseIndent) + Indent + 4, DumpOpts);
    else
      WithColor::error() << "decoding address ranges: "
                         << toString(RangesOrError.takeError()) << '\n';
  }

  OS << ")\n";
}